

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngvalid.c
# Opt level: O2

void make_size(png_store *ps,png_byte colour_type,int bdlo,int bdhi)

{
  int in_EAX;
  ulong uVar1;
  png_byte colour_type_00;
  undefined7 in_register_00000031;
  png_uint_32 width;
  int interlace_type;
  png_uint_32 height;
  png_uint_32 w;
  png_store *ps_00;
  
  ps_00 = (png_store *)((ulong)ps & 0xff);
  for (uVar1 = CONCAT71(in_register_00000031,colour_type) & 0xffffffff; (int)uVar1 <= bdlo;
      uVar1 = (ulong)((int)uVar1 + 1)) {
    for (interlace_type = 1; interlace_type != 0x11; interlace_type = interlace_type + 1) {
      for (w = 1; w != 0x11; w = w + 1) {
        colour_type_00 = (png_byte)(1 << ((byte)uVar1 & 0x1f));
        make_size_image(ps_00,colour_type_00,'\0',interlace_type,w,0,in_EAX);
        make_size_image(ps_00,colour_type_00,'\0',interlace_type,w,1,in_EAX);
        make_size_image(ps_00,colour_type_00,'\x01',interlace_type,w,0,in_EAX);
        make_size_image(ps_00,colour_type_00,'\x01',interlace_type,w,1,in_EAX);
      }
    }
  }
  return;
}

Assistant:

static void
make_size(png_store* const ps, png_byte const colour_type, int bdlo,
    int const bdhi)
{
   for (; bdlo <= bdhi; ++bdlo)
   {
      png_uint_32 width;

      for (width = 1; width <= 16; ++width)
      {
         png_uint_32 height;

         for (height = 1; height <= 16; ++height)
         {
            /* The four combinations of DIY interlace and interlace or not -
             * no interlace + DIY should be identical to no interlace with
             * libpng doing it.
             */
            make_size_image(ps, colour_type, DEPTH(bdlo), PNG_INTERLACE_NONE,
               width, height, 0);
            make_size_image(ps, colour_type, DEPTH(bdlo), PNG_INTERLACE_NONE,
               width, height, 1);
#        ifdef PNG_WRITE_INTERLACING_SUPPORTED
            make_size_image(ps, colour_type, DEPTH(bdlo), PNG_INTERLACE_ADAM7,
               width, height, 0);
#        endif
#        if CAN_WRITE_INTERLACE
            /* 1.7.0 removes the hack that prevented app write of an interlaced
             * image if WRITE_INTERLACE was not supported
             */
            make_size_image(ps, colour_type, DEPTH(bdlo), PNG_INTERLACE_ADAM7,
               width, height, 1);
#        endif
         }
      }
   }
}